

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

ZoneState * QDateTimePrivate::expressUtcAsLocal(qint64 utcMSecs)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  QTimeZonePrivate *pQVar4;
  qint64 qVar5;
  longlong *plVar6;
  qint64 in_RSI;
  ZoneState *in_RDI;
  long in_FS_OFFSET;
  optional<long_long> oVar7;
  qint64 jd;
  qint64 fakeUtc;
  qint64 diffMillis;
  YearMonthDay ymd;
  QTimeZone sys;
  optional<long_long> fakeJd;
  QTimeZone *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar8;
  undefined1 in_stack_ffffffffffffff17;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff2c;
  QTimeZonePrivate *in_stack_ffffffffffffff30;
  ZoneState *r;
  undefined1 *local_80;
  undefined1 *local_78;
  YearMonthDay local_70;
  undefined1 *local_60;
  int local_58;
  undefined1 *local_50;
  qint64 local_48;
  undefined8 local_40;
  bool local_38;
  _Storage<long_long,_true> local_30;
  undefined1 *local_28;
  qint64 local_20;
  undefined8 local_18;
  bool local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->when = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->offset = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->valid = &DAT_aaaaaaaaaaaaaaaa;
  r = in_RDI;
  ZoneState::ZoneState(in_RDI,in_RSI);
  bVar1 = millisInSystemRange(CONCAT17(in_stack_ffffffffffffff17,
                                       CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)
                                      ),(qint64)in_stack_ffffffffffffff08);
  if (bVar1) {
    QLocalTime::utcToLocal((qint64)in_stack_ffffffffffffff30);
    r->when = local_20;
    r->offset = (undefined4)local_18;
    r->dst = local_18._4_4_;
    r->valid = local_10;
    if ((r->valid & 1U) != 0) goto LAB_0056d019;
  }
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::systemTimeZone();
  bVar1 = QTimeZone::isValid(in_stack_ffffffffffffff08);
  if (bVar1) {
    in_stack_ffffffffffffff30 = QTimeZone::Data::operator->((Data *)&local_50);
    in_stack_ffffffffffffff2c =
         (*in_stack_ffffffffffffff30->_vptr_QTimeZonePrivate[8])(in_stack_ffffffffffffff30,in_RSI);
    r->offset = in_stack_ffffffffffffff2c;
    in_stack_ffffffffffffff24 = r->offset;
    iVar2 = QTimeZonePrivate::invalidSeconds();
    if (in_stack_ffffffffffffff24 == iVar2) goto LAB_0056ce25;
    eVar8 = qAddOverflow<long_long>(in_RSI,(long)r->offset * 1000,&r->when);
    if (eVar8) {
      bVar1 = true;
    }
    else {
      pQVar4 = QTimeZone::Data::operator->((Data *)&local_50);
      uVar3 = (*pQVar4->_vptr_QTimeZonePrivate[0xc])(pQVar4,in_RSI);
      r->dst = (uint)((uVar3 & 1) != 0);
      r->valid = true;
      bVar1 = true;
    }
  }
  else {
LAB_0056ce25:
    bVar1 = false;
  }
  QTimeZone::~QTimeZone((QTimeZone *)0x56ce3a);
  if (!bVar1) {
    qVar5 = msecsToJulianDay(0x56ce56);
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    local_70 = QGregorianCalendar::partsFromJulian((qint64)r);
    local_60 = (undefined1 *)local_70._0_8_;
    local_58 = local_70.day;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = (_Storage<long_long,_true>)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    systemTimeYearMatching(in_stack_ffffffffffffff24);
    oVar7 = QGregorianCalendar::julianFromParts
                      ((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (int)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    local_30._M_value =
         oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>._M_payload;
    local_28 = (undefined1 *)
               CONCAT71(local_28._1_7_,
                        oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
                        super__Optional_payload_base<long_long>._M_engaged);
    bVar1 = std::optional::operator_cast_to_bool((optional<long_long> *)0x56cf2e);
    eVar8 = true;
    if (bVar1) {
      plVar6 = std::optional<long_long>::operator*((optional<long_long> *)0x56cf54);
      bVar1 = qMulOverflow<long_long,_86400000LL>(qVar5 - *plVar6,&local_78);
      eVar8 = true;
      if (!bVar1) {
        eVar8 = qSubOverflow<long_long>(in_RSI,(longlong)local_78,(longlong *)&local_80);
      }
    }
    if (eVar8 == false) {
      QLocalTime::utcToLocal((qint64)in_stack_ffffffffffffff30);
      r->when = local_48;
      r->offset = (undefined4)local_40;
      r->dst = local_40._4_4_;
      r->valid = local_38;
      if (((r->valid & 1U) == 0) ||
         (eVar8 = qAddOverflow<long_long>(r->when,(longlong)local_78,&r->when), eVar8)) {
        r->when = in_RSI;
        r->valid = false;
      }
    }
  }
LAB_0056d019:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState QDateTimePrivate::expressUtcAsLocal(qint64 utcMSecs)
{
    ZoneState result{utcMSecs};
    // Within the time_t supported range, localtime() can handle it:
    if (millisInSystemRange(utcMSecs)) {
        result = QLocalTime::utcToLocal(utcMSecs);
        if (result.valid)
            return result;
    }

    // Docs state any LocalTime after 2038-01-18 *will* have any DST applied.
    // When this falls outside the supported range, we need to fake it.
#if QT_CONFIG(timezone) // Use the system time-zone.
    if (const auto sys = QTimeZone::systemTimeZone(); sys.isValid()) {
        result.offset = sys.d->offsetFromUtc(utcMSecs);
        if (result.offset != QTimeZonePrivate::invalidSeconds()) {
            if (qAddOverflow(utcMSecs, result.offset * MSECS_PER_SEC, &result.when))
                return result;
            result.dst = sys.d->isDaylightTime(utcMSecs) ? DaylightTime : StandardTime;
            result.valid = true;
            return result;
        }
    }
#endif // timezone

    // Kludge
    // Do the conversion in a year with the same days of the week, so DST
    // dates might be right, and adjust by the number of days that was off:
    const qint64 jd = msecsToJulianDay(utcMSecs);
    const auto ymd = QGregorianCalendar::partsFromJulian(jd);
    qint64 diffMillis, fakeUtc;
    const auto fakeJd = QGregorianCalendar::julianFromParts(systemTimeYearMatching(ymd.year),
                                                            ymd.month, ymd.day);
    if (Q_UNLIKELY(!fakeJd
                   || qMulOverflow(jd - *fakeJd, std::integral_constant<qint64, MSECS_PER_DAY>(),
                                   &diffMillis)
                   || qSubOverflow(utcMSecs, diffMillis, &fakeUtc))) {
        return result;
    }

    result = QLocalTime::utcToLocal(fakeUtc);
    // Now correct result.when for the use of the fake date:
    if (!result.valid || qAddOverflow(result.when, diffMillis, &result.when)) {
        // If utcToLocal() failed, its return has the fake when; restore utcMSecs.
        // Fail on overflow, but preserve offset and DST-ness.
        result.when = utcMSecs;
        result.valid = false;
    }
    return result;
}